

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O2

void DeleteIntervalList(CostManager *manager,CostInterval *interval)

{
  CostInterval *ptr;
  
  while (ptr = interval, ptr != (CostInterval *)0x0) {
    interval = ptr->next_;
    if (manager->intervals_ + 9 < ptr || ptr < manager->intervals_) {
      WebPSafeFree(ptr);
    }
  }
  return;
}

Assistant:

static void DeleteIntervalList(CostManager* const manager,
                               const CostInterval* interval) {
  while (interval != NULL) {
    const CostInterval* const next = interval->next_;
    if (!CostIntervalIsInFreeList(manager, interval)) {
      WebPSafeFree((void*)interval);
    }  // else: do nothing
    interval = next;
  }
}